

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_helpers.cc
# Opt level: O1

string * google::protobuf::compiler::cpp::FilenameIdentifier
                   (string *__return_storage_ptr__,string *filename)

{
  byte bVar1;
  pointer pcVar2;
  ulong uVar3;
  Hex hex;
  AlphaNum local_90;
  AlphaNum local_60;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  if (filename->_M_string_length != 0) {
    uVar3 = 0;
    do {
      pcVar2 = (filename->_M_dataplus)._M_p;
      bVar1 = pcVar2[uVar3];
      if (((byte)(bVar1 - 0x30) < 10) || ((byte)((bVar1 & 0xdf) + 0xbf) < 0x1a)) {
        std::__cxx11::string::push_back((char)__return_storage_ptr__);
      }
      else {
        local_90.piece_data_ = "_";
        local_90.piece_size_ = 1;
        hex.value = (ulong)(byte)pcVar2[uVar3];
        hex._8_8_ = 1;
        strings::AlphaNum::AlphaNum(&local_60,hex);
        StrAppend(__return_storage_ptr__,&local_90,&local_60);
      }
      uVar3 = uVar3 + 1;
    } while (uVar3 < filename->_M_string_length);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string FilenameIdentifier(const std::string& filename) {
  std::string result;
  for (int i = 0; i < filename.size(); i++) {
    if (ascii_isalnum(filename[i])) {
      result.push_back(filename[i]);
    } else {
      // Not alphanumeric.  To avoid any possibility of name conflicts we
      // use the hex code for the character.
      StrAppend(&result, "_", strings::Hex(static_cast<uint8>(filename[i])));
    }
  }
  return result;
}